

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::
getKindCandidates<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind>
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          HeapTypeGeneratorImpl *this,Shareability share)

{
  pointer pvVar1;
  iterator __position;
  Shareability SVar2;
  uintptr_t in_RAX;
  ulong uVar3;
  ulong uVar4;
  HeapType local_38;
  
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = (ulong)(this->recGroupEnds).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[this->index];
  if (uVar4 != 0) {
    uVar3 = 0;
    local_38.id = in_RAX;
    do {
      pvVar1 = (this->typeKinds).
               super__Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar1 != (pointer)0x0) &&
         (*(__index_type *)
           ((long)&pvVar1[uVar3].
                   super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
           + 1) == '\x01')) {
        local_38.id = ::wasm::TypeBuilder::getTempHeapType((ulong)this->builder);
        SVar2 = ::wasm::HeapType::getShared();
        if (SVar2 == share) {
          local_38.id = ::wasm::TypeBuilder::getTempHeapType((ulong)this->builder);
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
            _M_realloc_insert<wasm::HeapType>(__return_storage_ptr__,__position,&local_38);
          }
          else {
            (__position._M_current)->id = local_38.id;
            (__return_storage_ptr__->
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> getKindCandidates(Shareability share) {
    std::vector<HeapType> candidates;
    // Iterate through the top level kinds, finding matches for `Kind`. Since we
    // are constructing a child, we can only look through the end of the current
    // recursion group.
    for (Index i = 0, end = recGroupEnds[index]; i < end; ++i) {
      if (std::get_if<Kind>(&typeKinds[i]) &&
          share == HeapType(builder[i]).getShared()) {
        candidates.push_back(builder[i]);
      }
    }
    return candidates;
  }